

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

void ddClearFlag2(DdNode *f)

{
  DdNode *pDVar1;
  
  pDVar1 = f->next;
  while ((((ulong)pDVar1 & 1) != 0 &&
         (f->next = (DdNode *)((ulong)pDVar1 & 0xfffffffffffffffe), f->index != 0x7fffffff))) {
    ddClearFlag2((f->type).kids.T);
    f = (DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe);
    pDVar1 = f->next;
  }
  return;
}

Assistant:

void
ddClearFlag2(
  DdNode * f)
{
    if (!Cudd_IsComplement(f->next)) {
    return;
    }
    /* Clear visited flag. */
    f->next = Cudd_Regular(f->next);
    if (cuddIsConstant(f)) {
    return;
    }
    ddClearFlag2(cuddT(f));
    ddClearFlag2(Cudd_Regular(cuddE(f)));
    return;

}